

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UBool __thiscall
icu_63::Normalizer2Impl::hasCompBoundaryAfter
          (Normalizer2Impl *this,UChar *start,UChar *p,UBool onlyContiguous)

{
  uint uVar1;
  int c_00;
  int local_4c;
  int local_38;
  uint16_t __c2;
  int32_t __index;
  uint16_t norm16;
  UChar32 c;
  UBool onlyContiguous_local;
  UChar *p_local;
  UChar *start_local;
  Normalizer2Impl *this_local;
  
  if (start == p) {
    this_local._7_1_ = '\x01';
  }
  else {
    uVar1 = (uint)(ushort)p[-1];
    if ((uVar1 & 0xfffff800) == 0xd800) {
      if ((((p[-1] & 0x400U) == 0) || (p + -1 == start)) || ((p[-2] & 0xfc00U) != 0xd800)) {
        local_38 = this->normTrie->dataLength + -1;
      }
      else {
        c_00 = (uint)(ushort)p[-2] * 0x400 + uVar1 + -0x35fdc00;
        if (c_00 < this->normTrie->highStart) {
          local_4c = ucptrie_internalSmallIndex_63(this->normTrie,c_00);
        }
        else {
          local_4c = this->normTrie->dataLength + -2;
        }
        local_38 = local_4c;
      }
    }
    else {
      local_38 = (uint)this->normTrie->index[(int)uVar1 >> 6] + (uVar1 & 0x3f);
    }
    this_local._7_1_ =
         norm16HasCompBoundaryAfter
                   (this,*(uint16_t *)((long)(this->normTrie->data).ptr0 + (long)local_38 * 2),
                    onlyContiguous);
  }
  return this_local._7_1_;
}

Assistant:

UBool Normalizer2Impl::hasCompBoundaryAfter(const UChar *start, const UChar *p,
                                            UBool onlyContiguous) const {
    if (start == p) {
        return TRUE;
    }
    UChar32 c;
    uint16_t norm16;
    UCPTRIE_FAST_U16_PREV(normTrie, UCPTRIE_16, start, p, c, norm16);
    return norm16HasCompBoundaryAfter(norm16, onlyContiguous);
}